

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O3

ostream * operator<<(ostream *os,Am_Receive_Method *method)

{
  (*(method->from_wrapper->super_Am_Registered_Type)._vptr_Am_Registered_Type[2])
            (method->from_wrapper,os);
  return os;
}

Assistant:

void
Am_Connection::Reset(void)
{
  connection_list = nullptr;
  num_sockets = 0;
  max_socket = 0;
  m_parent_socket = 0;
  id_count = 0;
  socket_flags = new fd_set;
  FD_ZERO(socket_flags);
  Register_Default_Methods();
}